

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

int av1_optimize_b(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                  TXB_CTX *txb_ctx,int *rate_cost)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_stack_00000010;
  int segment_id;
  int eob;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  TX_TYPE in_stack_000008e6;
  TX_SIZE in_stack_000008e7;
  int in_stack_000008e8;
  int in_stack_000008ec;
  MACROBLOCK *in_stack_000008f0;
  AV1_COMP *in_stack_000008f8;
  TXB_CTX *in_stack_00001310;
  int *in_stack_00001318;
  int in_stack_00001320;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  CoeffCosts *in_stack_ffffffffffffffa0;
  undefined4 local_4;
  
  local_4 = (uint)*(ushort *)(*(long *)(in_RSI + (long)in_EDX * 0x88 + 0x20) + (long)in_ECX * 2);
  uVar1 = (uint)((byte)*(undefined2 *)(**(long **)(in_RSI + 0x2058) + 0xa7) & 7);
  if (((local_4 == 0) || (*(char *)(in_RDI + 0x427a0 + (long)(int)uVar1) == '\0')) ||
     (*(int *)(in_RSI + 0x2b64 + (long)(int)uVar1 * 4) != 0)) {
    iVar2 = av1_cost_skip_txb(in_stack_ffffffffffffffa0,
                              (TXB_CTX *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                              (TX_SIZE)((ulong)in_stack_ffffffffffffff90 >> 0x18));
    *in_stack_00000010 = iVar2;
  }
  else {
    local_4 = av1_optimize_txb(in_stack_000008f8,in_stack_000008f0,in_stack_000008ec,
                               in_stack_000008e8,in_stack_000008e7,in_stack_000008e6,
                               in_stack_00001310,in_stack_00001318,in_stack_00001320);
  }
  return local_4;
}

Assistant:

int av1_optimize_b(const struct AV1_COMP *cpi, MACROBLOCK *x, int plane,
                   int block, TX_SIZE tx_size, TX_TYPE tx_type,
                   const TXB_CTX *const txb_ctx, int *rate_cost) {
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[plane];
  const int eob = p->eobs[block];
  const int segment_id = xd->mi[0]->segment_id;

  if (eob == 0 || !cpi->optimize_seg_arr[segment_id] ||
      xd->lossless[segment_id]) {
    *rate_cost = av1_cost_skip_txb(&x->coeff_costs, txb_ctx, plane, tx_size);
    return eob;
  }

  return av1_optimize_txb(cpi, x, plane, block, tx_size, tx_type, txb_ctx,
                          rate_cost, cpi->oxcf.algo_cfg.sharpness);
}